

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

ArgumentInfo *
JitFFI::SysV64::GetArgInfo
          (ArgumentInfo *__return_storage_ptr__,ArgTypeUnit *restype,ArgTypeList *atlist)

{
  ArgTypeInfo *__return_storage_ptr___00;
  ArgTypeInfo *p_ati;
  ArgTypeList *atlist_local;
  ArgTypeUnit *restype_local;
  
  __return_storage_ptr___00 = (ArgTypeInfo *)operator_new(0x18);
  create_argtypeinfo(__return_storage_ptr___00,restype,atlist);
  ArgumentInfo::ArgumentInfo<JitFFI::SysV64::ArgTypeInfo>
            (__return_storage_ptr__,P_SysV64,__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

ArgumentInfo GetArgInfo(const ArgTypeUnit &restype, const ArgTypeList &atlist) {
			ArgTypeInfo *p_ati = new ArgTypeInfo(create_argtypeinfo(restype, atlist));
			return ArgumentInfo(P_SysV64, p_ati);
		}